

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O2

int main(int argc,char **argv)

{
  size_t sVar1;
  ptls_hash_algorithm_t *algo;
  st_ptls_ffx_test_variants_t *psVar2;
  ptls_cipher_suite_t **pppVar3;
  int iVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  ptls_cipher_context_t *ppVar7;
  X509 *pXVar8;
  X509_STORE *pXVar9;
  st_ptls_ffx_test_variants_t *psVar10;
  EVP_PKEY_CTX *ctx;
  stack_st_X509 *chain;
  X509_LOOKUP_METHOD *m;
  X509_LOOKUP *ctx_00;
  ENGINE *e;
  char *_name;
  char *pcVar11;
  long lVar12;
  ptls_iovec_t key;
  ptls_ech_create_opener_t ech_create_opener;
  ptls_openssl_sign_certificate_t openssl_sign_certificate;
  ptls_iovec_t minicrypto_certificate;
  ptls_iovec_t cert;
  ptls_openssl_verify_certificate_t openssl_verify_certificate;
  ptls_minicrypto_secp256r1sha256_sign_certificate_t minicrypto_sign_certificate;
  EVP_PKEY *pkey;
  ptls_get_time_t *local_3f0;
  ptls_key_exchange_algorithm_t **local_3e8;
  ptls_cipher_suite_t **local_3e0;
  ptls_iovec_t *local_3d8;
  size_t local_3d0;
  undefined1 local_3c8 [96];
  ptls_minicrypto_secp256r1sha256_sign_certificate_t *local_368;
  uint8_t encrypted [8];
  ptls_context_t openssl_ctx_sha256only;
  
  OPENSSL_init_crypto(2,0);
  OPENSSL_init_crypto(0xc,0);
  uVar5 = OSSL_PROVIDER_load(0,"legacy");
  uVar6 = OSSL_PROVIDER_load(0,"default");
  enter_subtest("bf");
  ppVar7 = ptls_cipher_new(&ptls_openssl_bfecb,1,test_bf_key);
  (*ppVar7->do_transform)(ppVar7,encrypted,&test_bf_plaintext,8);
  ptls_cipher_free(ppVar7);
  _ok((uint)(encrypted == (uint8_t  [8])0x61d2144ce730c0e1),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/openssl.c",0x72);
  ppVar7 = ptls_cipher_new(&ptls_openssl_bfecb,0,test_bf_key);
  (*ppVar7->do_transform)(ppVar7,&openssl_ctx_sha256only,"deadbeef",8);
  (*ppVar7->do_transform)(ppVar7,&openssl_ctx_sha256only,encrypted,8);
  ptls_cipher_free(ppVar7);
  _ok((uint)(openssl_ctx_sha256only.random_bytes == (_func_void_void_ptr_size_t *)0x78dd98614597f94e
            ),"%s %d","/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/openssl.c",
      0x79);
  exit_subtest("bf");
  enter_subtest("key-exchange");
  enter_subtest("secp256r1-self");
  test_key_exchange(&ptls_openssl_secp256r1,&ptls_openssl_secp256r1);
  exit_subtest("secp256r1-self");
  enter_subtest("secp256r1-to-minicrypto");
  test_key_exchange(&ptls_openssl_secp256r1,&ptls_minicrypto_secp256r1);
  exit_subtest("secp256r1-to-minicrypto");
  enter_subtest("secp256r1-from-minicrypto");
  test_key_exchange(&ptls_minicrypto_secp256r1,&ptls_openssl_secp256r1);
  exit_subtest("secp256r1-from-minicrypto");
  enter_subtest("secp384r1");
  test_key_exchange(&ptls_openssl_secp384r1,&ptls_openssl_secp384r1);
  exit_subtest("secp384r1");
  enter_subtest("secp521r1");
  test_key_exchange(&ptls_openssl_secp521r1,&ptls_openssl_secp521r1);
  exit_subtest("secp521r1");
  enter_subtest("x25519-self");
  test_key_exchange(&ptls_openssl_x25519,&ptls_openssl_x25519);
  exit_subtest("x25519-self");
  enter_subtest("x25519-to-minicrypto");
  test_key_exchange(&ptls_openssl_x25519,&ptls_minicrypto_x25519);
  exit_subtest("x25519-to-minicrypto");
  enter_subtest("x25519-from-minicrypto");
  test_key_exchange(&ptls_minicrypto_x25519,&ptls_openssl_x25519);
  exit_subtest("x25519-from-minicrypto");
  pcVar11 = "key-exchange";
  exit_subtest("key-exchange");
  pXVar8 = (X509 *)x509_from_pem(pcVar11);
  cert.base = (uint8_t *)0x0;
  iVar4 = i2d_X509(pXVar8,&cert.base);
  cert.len = (size_t)iVar4;
  X509_free(pXVar8);
  setup_sign_certificate(&openssl_sign_certificate);
  pXVar9 = X509_STORE_new();
  X509_STORE_set_verify_cb(pXVar9,verify_cert_cb);
  ptls_openssl_init_verify_certificate(&openssl_verify_certificate,(X509_STORE *)pXVar9);
  encrypted = (uint8_t  [8])ptls_openssl_random_bytes;
  memcpy(&openssl_ctx_sha256only,(ptls_context_t *)encrypted,0x140);
  pppVar3 = openssl_ctx_sha256only.cipher_suites;
  while (openssl_ctx_sha256only.cipher_suites = pppVar3,
        (*openssl_ctx_sha256only.cipher_suites)->hash->digest_size != 0x20) {
    sVar1 = ptls_openssl_cipher_suites_all[0]->hash->digest_size;
    pppVar3 = openssl_ctx_sha256only.cipher_suites + 1;
    if ((sVar1 != 0x30) && (sVar1 != 0x40)) {
      __assert_fail("openssl_ctx.cipher_suites[0]->hash->digest_size == 64 || openssl_ctx.cipher_suites[0]->hash->digest_size == 48"
                    ,"/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/openssl.c",
                    0x23c,"int main(int, char **)");
    }
  }
  psVar2 = ffx_variants;
  do {
    psVar10 = psVar2;
    psVar2 = psVar10 + 1;
  } while (psVar10->algo != (ptls_cipher_algorithm_t *)0x0);
  ::ctx = (ptls_context_t *)encrypted;
  ctx_peer = (ptls_context_t *)encrypted;
  verify_certificate = &openssl_verify_certificate.super;
  psVar10->algo = &ptls_ffx_ptls_openssl_aes128ctr_b125_r8;
  psVar10->bit_length = 0x7d;
  psVar2 = ffx_variants;
  do {
    psVar10 = psVar2;
    psVar2 = psVar10 + 1;
  } while (psVar10->algo != (ptls_cipher_algorithm_t *)0x0);
  psVar10->algo = &ptls_ffx_ptls_openssl_aes128ctr_b31_r6;
  psVar10->bit_length = 0x1f;
  psVar2 = ffx_variants;
  do {
    psVar10 = psVar2;
    psVar2 = psVar10 + 1;
  } while (psVar10->algo != (ptls_cipher_algorithm_t *)0x0);
  psVar10->algo = &ptls_ffx_ptls_openssl_aes128ctr_b53_r4;
  psVar10->bit_length = 0x35;
  psVar2 = ffx_variants;
  do {
    psVar10 = psVar2;
    psVar2 = psVar10 + 1;
  } while (psVar10->algo != (ptls_cipher_algorithm_t *)0x0);
  psVar10->algo = &ptls_ffx_ptls_openssl_chacha20_b256_r8;
  psVar10->bit_length = 0x100;
  psVar2 = ffx_variants;
  do {
    psVar10 = psVar2;
    psVar2 = psVar10 + 1;
  } while (psVar10->algo != (ptls_cipher_algorithm_t *)0x0);
  psVar10->algo = &ptls_ffx_ptls_openssl_chacha20_b32_r6;
  psVar10->bit_length = 0x20;
  psVar2 = ffx_variants;
  do {
    psVar10 = psVar2;
    psVar2 = psVar10 + 1;
  } while (psVar10->algo != (ptls_cipher_algorithm_t *)0x0);
  psVar10->algo = &ptls_ffx_ptls_openssl_chacha20_b57_r4;
  psVar10->bit_length = 0x39;
  enter_subtest("sha");
  for (lVar12 = 0; lVar12 != 0xd8; lVar12 = lVar12 + 0x48) {
    algo = *(ptls_hash_algorithm_t **)((long)&test_sha_all + lVar12);
    note("%s",algo->name);
    iVar4 = ptls_calc_hash(algo,&pkey,
                           "Alice was beginning to get very tired of sitting by her sister on the bank, and of having nothing to do: once or twice she had peeped into the book her sister was reading, but it had no pictures or conversations in it, and where is the use of a book, thought Alice, without pictures or conversations?"
                           ,300);
    _ok((uint)(iVar4 == 0),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/openssl.c",0xc2);
    iVar4 = bcmp(&pkey,&DAT_00146ca8 + lVar12,algo->digest_size);
    _ok((uint)(iVar4 == 0),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/openssl.c");
  }
  exit_subtest("sha");
  enter_subtest("rsa-sign");
  test_sign_verify((EVP_PKEY *)::ctx->sign_certificate[1].cb,
                   (ptls_openssl_signature_scheme_t *)::ctx->sign_certificate[2].cb);
  exit_subtest("rsa-sign");
  enter_subtest("ecdsa-sign");
  do_test_ecdsa_sign(0x19f,secp256r1_signature_schemes);
  do_test_ecdsa_sign(0x2cb,secp384r1_signature_schemes);
  do_test_ecdsa_sign(0x2cc,secp521r1_signature_schemes);
  exit_subtest("ecdsa-sign");
  enter_subtest("ed25519-sign");
  pkey = (EVP_PKEY *)0x0;
  ctx = EVP_PKEY_CTX_new_id(0x43f,(ENGINE *)0x0);
  EVP_PKEY_keygen_init(ctx);
  EVP_PKEY_keygen(ctx,(EVP_PKEY **)&pkey);
  EVP_PKEY_CTX_free(ctx);
  test_sign_verify(pkey,ed25519_signature_schemes);
  EVP_PKEY_free((EVP_PKEY *)pkey);
  exit_subtest("ed25519-sign");
  pcVar11 = "cert-verify";
  enter_subtest("cert-verify");
  pXVar8 = (X509 *)x509_from_pem(pcVar11);
  chain = (stack_st_X509 *)OPENSSL_sk_new_null();
  pXVar9 = X509_STORE_new();
  iVar4 = verify_cert_chain((X509_STORE *)pXVar9,(X509 *)pXVar8,chain,0,"test.example.com",
                            (int *)&pkey);
  _ok((uint)(iVar4 == 0x30),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/openssl.c",0x11a);
  m = X509_LOOKUP_file();
  ctx_00 = X509_STORE_add_lookup(pXVar9,m);
  iVar4 = X509_LOOKUP_ctrl(ctx_00,1,"t/assets/test-ca.crt",1,(char **)0x0);
  _ok(iVar4,"%s %d","/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/openssl.c");
  iVar4 = verify_cert_chain((X509_STORE *)pXVar9,(X509 *)pXVar8,chain,0,"test.example.com",
                            (int *)&pkey);
  _ok((uint)(iVar4 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/openssl.c");
  iVar4 = verify_cert_chain((X509_STORE *)pXVar9,(X509 *)pXVar8,chain,0,"test2.example.com",
                            (int *)&pkey);
  _ok((uint)(iVar4 == 0x2a),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/openssl.c");
  X509_free(pXVar8);
  OPENSSL_sk_free(chain);
  X509_STORE_free(pXVar9);
  exit_subtest("cert-verify");
  enter_subtest("picotls");
  test_picotls();
  exit_subtest("picotls");
  ::ctx = &openssl_ctx_sha256only;
  ctx_peer = &openssl_ctx_sha256only;
  enter_subtest("picotls");
  test_picotls();
  exit_subtest("picotls");
  ::ctx = &openssl_ctx_sha256only;
  ctx_peer = (ptls_context_t *)encrypted;
  enter_subtest("picotls");
  test_picotls();
  exit_subtest("picotls");
  ::ctx = (ptls_context_t *)encrypted;
  ctx_peer = &openssl_ctx_sha256only;
  enter_subtest("picotls");
  test_picotls();
  exit_subtest("picotls");
  minicrypto_certificate.base = (uint8_t *)anon_var_dwarf_2f6ca;
  minicrypto_certificate.len = 0x264;
  key.len = 0x20;
  key.base = (uint8_t *)anon_var_dwarf_2f6e2;
  ptls_minicrypto_init_secp256r1sha256_sign_certificate(&minicrypto_sign_certificate,key);
  memset(local_3c8,0,0x110);
  pkey = (EVP_PKEY *)ptls_minicrypto_random_bytes;
  local_3f0 = &ptls_get_time;
  local_3e8 = ptls_minicrypto_key_exchanges;
  local_3e0 = ptls_minicrypto_cipher_suites;
  local_3d0 = 1;
  ::ctx = (ptls_context_t *)encrypted;
  ctx_peer = (ptls_context_t *)&pkey;
  local_3d8 = &minicrypto_certificate;
  local_368 = &minicrypto_sign_certificate;
  enter_subtest("vs. minicrypto");
  test_picotls();
  exit_subtest("vs. minicrypto");
  ::ctx = (ptls_context_t *)&pkey;
  ctx_peer = (ptls_context_t *)encrypted;
  enter_subtest("minicrypto vs.");
  test_picotls();
  exit_subtest("minicrypto vs.");
  enter_subtest("hpke");
  test_hpke(ptls_openssl_hpke_kems,ptls_openssl_hpke_cipher_suites);
  exit_subtest("hpke");
  openssl_sign_certificate._24_1_ = openssl_sign_certificate._24_1_ & 0xfe;
  ::ctx = (ptls_context_t *)encrypted;
  ctx_peer = (ptls_context_t *)encrypted;
  enter_subtest("many-handshakes-non-async");
  many_handshakes();
  exit_subtest("many-handshakes-non-async");
  openssl_sign_certificate._24_1_ = openssl_sign_certificate._24_1_ & 0xfe;
  enter_subtest("many-handshakes-async");
  many_handshakes();
  exit_subtest("many-handshakes-async");
  e = ENGINE_by_id("qatengine");
  if (e == (ENGINE *)0x0) {
    e = ENGINE_by_id("dynamic");
    if (e != (ENGINE *)0x0) {
      iVar4 = ENGINE_ctrl_cmd_string(e,"SO_PATH","qatengine",0);
      if ((iVar4 != 0) && (iVar4 = ENGINE_ctrl_cmd_string(e,"LOAD",(char *)0x0,0), iVar4 != 0))
      goto LAB_0012fb78;
      ENGINE_free(e);
    }
    note("%s not found","qatengine");
  }
  else {
LAB_0012fb78:
    ENGINE_set_default_RSA(e);
    EVP_PKEY_free((EVP_PKEY *)openssl_sign_certificate.key);
    setup_sign_certificate(&openssl_sign_certificate);
    enter_subtest("many-handshakes-qatengine");
    many_handshakes();
    exit_subtest("many-handshakes-qatengine");
  }
  iVar4 = done_testing();
  OSSL_PROVIDER_unload(uVar6);
  OSSL_PROVIDER_unload(uVar5);
  return iVar4;
}

Assistant:

int main(int argc, char **argv)
{
    ptls_openssl_sign_certificate_t openssl_sign_certificate;
    ptls_openssl_verify_certificate_t openssl_verify_certificate;
    ptls_ech_create_opener_t ech_create_opener = {.cb = create_ech_opener};

    ERR_load_crypto_strings();
    OpenSSL_add_all_algorithms();

#if !defined(LIBRESSL_VERSION_NUMBER) && OPENSSL_VERSION_NUMBER >= 0x30000000L
    /* Explicitly load the legacy provider in addition to default, as we test Blowfish in one of the tests. */
    OSSL_PROVIDER *legacy = OSSL_PROVIDER_load(NULL, "legacy");
    OSSL_PROVIDER *dflt = OSSL_PROVIDER_load(NULL, "default");
#elif !defined(OPENSSL_NO_ENGINE)
    /* Load all compiled-in ENGINEs */
    ENGINE_load_builtin_engines();
    ENGINE_register_all_ciphers();
    ENGINE_register_all_digests();
#endif

    subtest("bf", test_bf);

    subtest("key-exchange", test_key_exchanges);

    ptls_iovec_t cert;
    setup_certificate(&cert);
    setup_sign_certificate(&openssl_sign_certificate);
    X509_STORE *cert_store = X509_STORE_new();
    X509_STORE_set_verify_cb(cert_store, verify_cert_cb);
    ptls_openssl_init_verify_certificate(&openssl_verify_certificate, cert_store);
    /* we should call X509_STORE_free on OpenSSL 1.1 or in prior versions decrement refount then call _free */
    ptls_context_t openssl_ctx = {.random_bytes = ptls_openssl_random_bytes,
                                  .get_time = &ptls_get_time,
                                  .key_exchanges = ptls_openssl_key_exchanges,
                                  .cipher_suites = ptls_openssl_cipher_suites_all,
                                  .tls12_cipher_suites = ptls_openssl_tls12_cipher_suites,
                                  .certificates = {&cert, 1},
                                  .ech = {.client = {.ciphers = ptls_openssl_hpke_cipher_suites, .kems = ptls_openssl_hpke_kems},
                                          .server = {.create_opener = &ech_create_opener,
                                                     .retry_configs = {(uint8_t *)ECH_CONFIG_LIST, sizeof(ECH_CONFIG_LIST) - 1}}},
                                  .sign_certificate = &openssl_sign_certificate.super};
    ptls_context_t openssl_ctx_sha256only = openssl_ctx;
    while (openssl_ctx_sha256only.cipher_suites[0]->hash->digest_size != 32) {
        assert(openssl_ctx.cipher_suites[0]->hash->digest_size == 64 || /* sha512 */
               openssl_ctx.cipher_suites[0]->hash->digest_size == 48);  /* sha384 */
        ++openssl_ctx_sha256only.cipher_suites;
    }
    assert(openssl_ctx_sha256only.cipher_suites[0]->hash->digest_size == 32); /* sha256 */

    ctx = ctx_peer = &openssl_ctx;
    verify_certificate = &openssl_verify_certificate.super;
    ADD_FFX_AES128_ALGORITHMS(openssl);
#if PTLS_OPENSSL_HAVE_CHACHA20_POLY1305
    ADD_FFX_CHACHA20_ALGORITHMS(openssl);
#endif

    subtest("sha", test_sha);
    subtest("rsa-sign", test_rsa_sign);
    subtest("ecdsa-sign", test_ecdsa_sign);
    subtest("ed25519-sign", test_ed25519_sign);
    subtest("cert-verify", test_cert_verify);
    subtest("picotls", test_picotls);

    ctx = ctx_peer = &openssl_ctx_sha256only;
    subtest("picotls", test_picotls);

    ctx = &openssl_ctx_sha256only;
    ctx_peer = &openssl_ctx;
    subtest("picotls", test_picotls);

    ctx = &openssl_ctx;
    ctx_peer = &openssl_ctx_sha256only;
    subtest("picotls", test_picotls);

    ptls_minicrypto_secp256r1sha256_sign_certificate_t minicrypto_sign_certificate;
    ptls_iovec_t minicrypto_certificate = ptls_iovec_init(SECP256R1_CERTIFICATE, sizeof(SECP256R1_CERTIFICATE) - 1);
    ptls_minicrypto_init_secp256r1sha256_sign_certificate(
        &minicrypto_sign_certificate, ptls_iovec_init(SECP256R1_PRIVATE_KEY, sizeof(SECP256R1_PRIVATE_KEY) - 1));
    ptls_context_t minicrypto_ctx = {.random_bytes = ptls_minicrypto_random_bytes,
                                     .get_time = &ptls_get_time,
                                     .key_exchanges = ptls_minicrypto_key_exchanges,
                                     .cipher_suites = ptls_minicrypto_cipher_suites,
                                     .certificates = {&minicrypto_certificate, 1},
                                     .sign_certificate = &minicrypto_sign_certificate.super};
    ctx = &openssl_ctx;
    ctx_peer = &minicrypto_ctx;
    subtest("vs. minicrypto", test_picotls);

    ctx = &minicrypto_ctx;
    ctx_peer = &openssl_ctx;
    subtest("minicrypto vs.", test_picotls);

    subtest("hpke", test_all_hpke);

#if ASYNC_TESTS
    // switch to x25519 / aes128gcmsha256 as we run benchmarks
    static ptls_key_exchange_algorithm_t *fast_keyex[] = {&ptls_openssl_x25519, NULL}; // use x25519 for speed
    static ptls_cipher_suite_t *fast_cipher[] = {&ptls_openssl_aes128gcmsha256, NULL};
    openssl_ctx.key_exchanges = fast_keyex;
    openssl_ctx.cipher_suites = fast_cipher;
    ctx = &openssl_ctx;
    ctx_peer = &openssl_ctx;
    openssl_sign_certificate.async = 0;
    subtest("many-handshakes-non-async", many_handshakes);
    openssl_sign_certificate.async = 0;
    subtest("many-handshakes-async", many_handshakes);
    { /* qatengine should be tested at last, because we do not have the code to unload or un-default it */
        const char *engine_name = "qatengine";
        ENGINE *qatengine;
        if ((qatengine = ENGINE_by_id(engine_name)) != NULL || (qatengine = load_engine(engine_name)) != NULL) {
            ENGINE_set_default_RSA(qatengine);
            ptls_openssl_dispose_sign_certificate(&openssl_sign_certificate); // reload cert to use qatengine
            setup_sign_certificate(&openssl_sign_certificate);
            subtest("many-handshakes-qatengine", many_handshakes);
        } else {
            note("%s not found", engine_name);
        }
    }
#endif

    int ret = done_testing();
#if !defined(LIBRESSL_VERSION_NUMBER) && OPENSSL_VERSION_NUMBER >= 0x30000000L
    OSSL_PROVIDER_unload(dflt);
    OSSL_PROVIDER_unload(legacy);
#endif
    return ret;
}